

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

Gia_Man_t *
Gia_ManResub1(char *pFileName,int nNodes,int nSupp,int nDivs,int iChoice,int fUseXor,int fVerbose,
             int fVeryVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Wrd_t *vSims_00;
  Gia_ResbMan_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *vVec1;
  Vec_Ptr_t *local_58;
  Vec_Wec_t *vGates;
  Gia_ResbMan_t *p;
  Vec_Ptr_t *vDivs;
  Vec_Wrd_t *vSims;
  Gia_Man_t *pMan;
  int nWords;
  int fUseXor_local;
  int iChoice_local;
  int nDivs_local;
  int nSupp_local;
  int nNodes_local;
  char *pFileName_local;
  
  pMan._0_4_ = 0;
  vSims = (Vec_Wrd_t *)0x0;
  pMan._4_4_ = fUseXor;
  nWords = iChoice;
  fUseXor_local = nDivs;
  iChoice_local = nSupp;
  nDivs_local = nNodes;
  _nSupp_local = pFileName;
  vSims_00 = Vec_WrdReadHex(pFileName,(int *)&pMan,1);
  if (vSims_00 == (Vec_Wrd_t *)0x0) {
    local_58 = (Vec_Ptr_t *)0x0;
  }
  else {
    local_58 = Gia_ManDeriveDivs(vSims_00,(int)pMan);
  }
  p_00 = Gia_ResbAlloc((int)pMan);
  iVar1 = Vec_PtrSize(local_58);
  if (0x3fff < iVar1) {
    uVar2 = Vec_PtrSize(local_58);
    printf("Reducing all divs from %d to %d.\n",(ulong)uVar2,0x3fff);
    Vec_PtrShrink(local_58,0x3fff);
  }
  iVar1 = Vec_PtrSize(local_58);
  if (iVar1 < 0x4000) {
    Gia_ManResubPerform(p_00,local_58,(int)pMan,100,0x32,nWords,pMan._4_4_,1,1);
    iVar1 = Vec_IntSize(p_00->vGates);
    if (iVar1 == 0) {
      printf("Decomposition did not succeed.\n");
    }
    else {
      p_01 = Vec_WecStart(1);
      vVec1 = Vec_WecEntry(p_01,0);
      Vec_IntAppend(vVec1,p_00->vGates);
      iVar1 = Vec_PtrSize(local_58);
      vSims = (Vec_Wrd_t *)Gia_ManConstructFromGates(p_01,iVar1);
      Vec_WecFree(p_01);
    }
    Gia_ResbFree(p_00);
    Vec_PtrFree(local_58);
    Vec_WrdFree(vSims_00);
    return (Gia_Man_t *)vSims;
  }
  __assert_fail("Vec_PtrSize(vDivs) < (1<<14)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                ,0x661,"Gia_Man_t *Gia_ManResub1(char *, int, int, int, int, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManResub1( char * pFileName, int nNodes, int nSupp, int nDivs, int iChoice, int fUseXor, int fVerbose, int fVeryVerbose )
{
    int nWords = 0;
    Gia_Man_t * pMan   = NULL;
    Vec_Wrd_t * vSims  = Vec_WrdReadHex( pFileName, &nWords, 1 );
    Vec_Ptr_t * vDivs  = vSims ? Gia_ManDeriveDivs( vSims, nWords ) : NULL;
    Gia_ResbMan_t * p = Gia_ResbAlloc( nWords );
    //Gia_ManCheckResub( vDivs, nWords );
    if ( Vec_PtrSize(vDivs) >= (1<<14) )
    {
        printf( "Reducing all divs from %d to %d.\n", Vec_PtrSize(vDivs), (1<<14)-1 );
        Vec_PtrShrink( vDivs, (1<<14)-1 );
    }
    assert( Vec_PtrSize(vDivs) < (1<<14) );
    Gia_ManResubPerform( p, vDivs, nWords, 100, 50, iChoice, fUseXor, 1, 1 );
    if ( Vec_IntSize(p->vGates) )
    {
        Vec_Wec_t * vGates = Vec_WecStart(1);
        Vec_IntAppend( Vec_WecEntry(vGates, 0), p->vGates );
        pMan = Gia_ManConstructFromGates( vGates, Vec_PtrSize(vDivs) );
        Vec_WecFree( vGates );
    }
    else
        printf( "Decomposition did not succeed.\n" );
    Gia_ResbFree( p );
    Vec_PtrFree( vDivs );
    Vec_WrdFree( vSims );
    return pMan;
}